

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Abc_FrameMiniAigSetAndGateDelay(Abc_Frame_t *pAbc,int Delay)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGia;
  int Delay_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  pGVar1 = Abc_FrameReadGia(pAbc);
  if (pGVar1 == (Gia_Man_t *)0x0) {
    printf("Current network in ABC framework is not defined.\n");
  }
  pGVar1->And2Delay = Delay;
  return;
}

Assistant:

void Abc_FrameMiniAigSetAndGateDelay( Abc_Frame_t * pAbc, int Delay )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    pGia->And2Delay = Delay;
}